

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void laguerre_ek_compute(int n,double *x,double *w)

{
  double *e;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar1 = (ulong)(uint)n << 3;
  }
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  e = (double *)operator_new__(uVar1);
  uVar1 = 0;
  while (uVar3 != uVar1) {
    e[uVar1] = (double)(int)(uVar1 + 1);
    uVar1 = uVar1 + 1;
  }
  for (lVar2 = 0; uVar3 * 2 - lVar2 != 0; lVar2 = lVar2 + 2) {
    *(double *)((long)x + lVar2 * 4) = (double)((int)lVar2 + 1);
  }
  *w = 1.0;
  for (lVar2 = 1; lVar2 < n; lVar2 = lVar2 + 1) {
    w[lVar2] = 0.0;
  }
  imtqlx(n,x,e,w);
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    w[uVar1] = w[uVar1] * w[uVar1];
  }
  operator_delete__(e);
  return;
}

Assistant:

void laguerre_ek_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_EK_COMPUTE: Laguerre quadrature rule by the Elhay-Kautsky method.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *bj;
  int i;
  double zemu;
//
//  Define the zero-th moment.
//
  zemu = 1.0;
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  for ( i = 0; i < n; i++ )
  {
    bj[i] = double( i + 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = double( 2 * i + 1 );
  }

  w[0] = sqrt ( zemu );

  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}